

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton_tests.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  SingletonDatabase *pSVar2;
  ostream *this;
  allocator<char> local_39;
  string local_38 [32];
  SingletonDatabase *local_18;
  SingletonDatabase *sd;
  
  sd._4_4_ = 0;
  pSVar2 = SingletonDatabase::get();
  local_18 = pSVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"Tokyo",&local_39);
  iVar1 = (**(pSVar2->super_IDatabase)._vptr_IDatabase)(pSVar2,local_38);
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  return 0;
}

Assistant:

int main()
{
	//auto* nsd{NaiveSingletonDatabase::get_instance()};
	//NaiveSingletonDatabase::destroy_instance();

	auto& sd{SingletonDatabase::get()};
	std::cout << sd.get_population("Tokyo") << std::endl;

	return 0;
}